

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O3

int aead_aegis_128l_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __n;
  int line;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  aes_block_t tmp;
  undefined1 auVar13 [16];
  aes_block_t msg1;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  uint8_t padded_nonce [16];
  undefined1 local_b8 [16];
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  size_t *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar1 = ctx->tag_len;
  if (max_out_tag_len < bVar1) {
    iVar2 = 0x67;
    line = 0xdb;
  }
  else {
    if (nonce_len < 0x11) {
      local_b8 = (undefined1  [16])0x0;
      local_90 = out_tag_len;
      if (nonce_len != 0) {
        memcpy(local_b8,nonce,nonce_len);
      }
      auVar9 = *(undefined1 (*) [16])&ctx->state;
      auVar30 = ZEXT1664(auVar9 ^ local_b8);
      auVar26 = ZEXT1664(_DAT_00250ff0);
      auVar19 = ZEXT1664(_DAT_00250ff0 ^ auVar9);
      auVar25 = ZEXT1664(_DAT_00251000);
      auVar22 = ZEXT1664(_DAT_00251000 ^ auVar9);
      iVar2 = 10;
      auVar23 = ZEXT1664(_DAT_00250ff0 ^ auVar9);
      auVar28 = ZEXT1664(_DAT_00251000);
      auVar29 = ZEXT1664(auVar9 ^ local_b8);
      do {
        auVar16 = aesenc(auVar19._0_16_,auVar29._0_16_);
        auVar18 = aesenc(auVar22._0_16_,auVar19._0_16_);
        auVar19._0_32_ = ZEXT1632(auVar18);
        auVar21 = aesenc(auVar23._0_16_,auVar22._0_16_);
        auVar22._0_32_ = ZEXT1632(auVar21);
        auVar21 = aesenc(auVar30._0_16_,auVar23._0_16_);
        auVar23._0_32_ = ZEXT1632(auVar21);
        auVar21 = aesenc(auVar25._0_16_,auVar30._0_16_);
        auVar24 = aesenc(auVar26._0_16_,auVar25._0_16_);
        auVar25._0_32_ = ZEXT1632(auVar24);
        auVar24 = aesenc(auVar28._0_16_,auVar26._0_16_);
        auVar26._0_32_ = ZEXT1632(auVar24);
        auVar24 = aesenc(auVar29._0_16_,auVar28._0_16_);
        auVar28._0_32_ = ZEXT1632(auVar24);
        auVar29 = ZEXT1664(auVar16 ^ local_b8);
        auVar30 = ZEXT1664(auVar21 ^ auVar9);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      if (ad_len < 0x20) {
        lVar5 = 0;
      }
      else {
        lVar3 = 0;
        do {
          auVar16 = aesenc(auVar22._0_16_,auVar18);
          auVar19._0_32_ = ZEXT1632(auVar16);
          auVar9 = aesenc(auVar23._0_16_,auVar22._0_16_);
          auVar22._0_32_ = ZEXT1632(auVar9);
          auVar9 = aesenc(auVar30._0_16_,auVar23._0_16_);
          auVar23._0_32_ = ZEXT1632(auVar9);
          auVar21 = aesenc(auVar25._0_16_,auVar30._0_16_);
          auVar9 = aesenc(auVar26._0_16_,auVar25._0_16_);
          auVar25._0_32_ = ZEXT1632(auVar9);
          auVar9 = aesenc(auVar28._0_16_,auVar26._0_16_);
          auVar26._0_32_ = ZEXT1632(auVar9);
          auVar9 = aesenc(auVar29._0_16_,auVar28._0_16_);
          auVar28._0_32_ = ZEXT1632(auVar9);
          auVar9 = aesenc(auVar18,auVar29._0_16_);
          auVar29 = ZEXT1664(auVar9 ^ *(undefined1 (*) [16])(ad + lVar3));
          auVar30 = ZEXT1664(auVar21 ^ *(undefined1 (*) [16])(ad + lVar3 + 0x10));
          lVar5 = lVar3 + 0x20;
          uVar6 = lVar3 + 0x40;
          lVar3 = lVar5;
          auVar18 = auVar16;
        } while (uVar6 <= ad_len);
      }
      auVar20 = auVar19._32_32_;
      uVar6 = ad_len & 0x1f;
      if (uVar6 != 0) {
        memset(local_b8 + uVar6,0,0x20 - uVar6);
        memcpy(local_b8,ad + lVar5,uVar6);
        auVar9 = aesenc(auVar19._0_16_,auVar29._0_16_);
        auVar18 = aesenc(auVar22._0_16_,auVar19._0_16_);
        auVar19._0_32_ = ZEXT1632(auVar18);
        auVar19._32_32_ = auVar20;
        auVar18 = aesenc(auVar23._0_16_,auVar22._0_16_);
        auVar22 = ZEXT1664(auVar18);
        auVar18 = aesenc(auVar30._0_16_,auVar23._0_16_);
        auVar23 = ZEXT1664(auVar18);
        auVar18 = aesenc(auVar25._0_16_,auVar30._0_16_);
        auVar21 = aesenc(auVar26._0_16_,auVar25._0_16_);
        auVar25 = ZEXT1664(auVar21);
        auVar21 = aesenc(auVar28._0_16_,auVar26._0_16_);
        auVar26 = ZEXT1664(auVar21);
        auVar21 = aesenc(auVar29._0_16_,auVar28._0_16_);
        auVar28 = ZEXT1664(auVar21);
        auVar29 = ZEXT1664(auVar9 ^ local_b8);
        auVar9._8_8_ = uStack_a0;
        auVar9._0_8_ = uStack_a8;
        auVar30 = ZEXT1664(auVar18 ^ auVar9);
      }
      if (in_len < 0x20) {
        sVar8 = 0;
      }
      else {
        sVar4 = 0;
        auVar9 = auVar19._0_16_;
        do {
          auVar18 = *(undefined1 (*) [16])(in + sVar4);
          auVar21 = *(undefined1 (*) [16])(in + sVar4 + 0x10);
          auVar14 = auVar25._0_16_;
          auVar17 = auVar26._0_16_;
          auVar16 = vpand_avx(auVar14,auVar17);
          auVar15 = auVar22._0_16_;
          auVar13 = auVar28._0_16_;
          auVar24 = vpand_avx(auVar9,auVar15);
          auVar27 = auVar23._0_16_;
          *(undefined1 (*) [16])(out + sVar4) = auVar16 ^ auVar13 ^ auVar15 ^ auVar18;
          auVar11 = aesenc(auVar15,auVar9);
          auVar19 = ZEXT1664(auVar11);
          auVar16 = aesenc(auVar27,auVar15);
          auVar22._0_32_ = ZEXT1632(auVar16);
          auVar16 = aesenc(auVar30._0_16_,auVar27);
          auVar23._0_32_ = ZEXT1632(auVar16);
          auVar16 = aesenc(auVar14,auVar30._0_16_);
          auVar15 = aesenc(auVar17,auVar14);
          auVar25._0_32_ = ZEXT1632(auVar15);
          auVar15 = aesenc(auVar13,auVar17);
          auVar26._0_32_ = ZEXT1632(auVar15);
          auVar15 = aesenc(auVar29._0_16_,auVar13);
          auVar28._0_32_ = ZEXT1632(auVar15);
          auVar9 = aesenc(auVar9,auVar29._0_16_);
          *(undefined1 (*) [16])(out + sVar4 + 0x10) = auVar17 ^ auVar27 ^ auVar24 ^ auVar21;
          auVar29 = ZEXT1664(auVar9 ^ auVar18);
          auVar30 = ZEXT1664(auVar16 ^ auVar21);
          sVar8 = sVar4 + 0x20;
          uVar6 = sVar4 + 0x40;
          sVar4 = sVar8;
          auVar9 = auVar11;
        } while (uVar6 <= in_len);
      }
      local_b8 = ZEXT816(0);
      uStack_a8 = 0;
      uStack_a0 = 0;
      sVar7 = in_len - sVar8;
      auVar9 = auVar19._0_16_;
      auVar18 = auVar22._0_16_;
      auVar21 = auVar23._0_16_;
      auVar16 = auVar25._0_16_;
      auVar24 = auVar26._0_16_;
      auVar11 = auVar28._0_16_;
      auVar15 = auVar29._0_16_;
      auVar27 = auVar30._0_16_;
      if (extra_in_len == 0) {
        if (in_len != sVar8) {
          memcpy(local_b8,in + sVar8,sVar7);
          auVar17._8_8_ = uStack_a0;
          auVar17._0_8_ = uStack_a8;
          auVar14 = vpand_avx(auVar16,auVar24);
          local_88 = auVar14 ^ auVar11 ^ auVar18 ^ local_b8;
          auVar14 = vpand_avx(auVar18,auVar9);
          local_78 = auVar14 ^ auVar21 ^ auVar24 ^ auVar17;
          auVar14 = aesenc(auVar9,auVar15);
          auVar14 = auVar14 ^ local_b8;
          auVar15 = aesenc(auVar15,auVar11);
          auVar11 = aesenc(auVar11,auVar24);
          auVar24 = aesenc(auVar24,auVar16);
          auVar16 = aesenc(auVar16,auVar27);
          auVar27 = aesenc(auVar27,auVar21);
          auVar21 = aesenc(auVar21,auVar18);
          auVar9 = aesenc(auVar18,auVar9);
          memcpy(out + sVar8,local_88,sVar7);
          auVar19 = ZEXT1664(auVar9);
          auVar22 = ZEXT1664(auVar21);
          auVar23 = ZEXT1664(auVar27);
          auVar30 = ZEXT1664(auVar16 ^ auVar17);
          auVar25 = ZEXT1664(auVar24);
          auVar26 = ZEXT1664(auVar11);
          auVar28 = ZEXT1664(auVar15);
          auVar29 = ZEXT1664(auVar14);
        }
      }
      else {
        __n = 0x20 - sVar7;
        if (extra_in_len <= 0x20 - sVar7) {
          __n = extra_in_len;
        }
        if (in_len != sVar8) {
          memcpy(local_b8,in + sVar8,sVar7);
          auVar28 = ZEXT1664(auVar11);
          auVar26 = ZEXT1664(auVar24);
          auVar25 = ZEXT1664(auVar16);
          auVar23 = ZEXT1664(auVar21);
          auVar22 = ZEXT1664(auVar18);
        }
        if (sVar7 != 0x20) {
          memcpy(local_b8 + sVar7,extra_in,__n);
          auVar28 = ZEXT1664(auVar11);
          auVar26 = ZEXT1664(auVar24);
          auVar25 = ZEXT1664(auVar16);
          auVar23 = ZEXT1664(auVar21);
          auVar22 = ZEXT1664(auVar18);
        }
        auVar17 = local_b8;
        local_48._8_8_ = uStack_a0;
        local_48._0_8_ = uStack_a8;
        auVar14 = vpand_avx(auVar26._0_16_,auVar25._0_16_);
        local_88 = auVar14 ^ auVar28._0_16_ ^ auVar22._0_16_ ^ local_b8;
        auVar20 = (undefined1  [32])0x0;
        auVar14 = vpand_avx(auVar22._0_16_,auVar9);
        local_78 = auVar14 ^ auVar26._0_16_ ^ auVar23._0_16_ ^ local_48;
        if (in_len != sVar8) {
          auVar20 = (undefined1  [32])0x0;
          memcpy(out + sVar8,local_88,sVar7);
          auVar28 = ZEXT1664(auVar11);
          auVar26 = ZEXT1664(auVar24);
          auVar25 = ZEXT1664(auVar16);
          auVar23 = ZEXT1664(auVar21);
          auVar22 = ZEXT1664(auVar18);
        }
        auVar13 = aesenc(auVar25._0_16_,auVar27);
        auVar14 = aesenc(auVar9,auVar15);
        if (sVar7 != 0x20) {
          auVar20 = SUB4832((undefined1  [48])0x0,0x10);
          local_68 = auVar14;
          local_58 = auVar13;
          memcpy(out_tag,local_88 + sVar7,__n);
          auVar28 = ZEXT1664(auVar11);
          auVar26 = ZEXT1664(auVar24);
          auVar25 = ZEXT1664(auVar16);
          auVar23 = ZEXT1664(auVar21);
          auVar22 = ZEXT1664(auVar18);
          auVar14 = local_68;
          auVar13 = local_58;
        }
        auVar9 = aesenc(auVar22._0_16_,auVar9);
        auVar12._0_32_ = ZEXT1632(auVar9);
        auVar12._32_32_ = auVar20;
        auVar18 = aesenc(auVar23._0_16_,auVar22._0_16_);
        auVar22._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar27,auVar23._0_16_);
        auVar23._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar26._0_16_,auVar25._0_16_);
        auVar25._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar28._0_16_,auVar26._0_16_);
        auVar26._0_32_ = ZEXT1632(auVar18);
        auVar18 = aesenc(auVar15,auVar28._0_16_);
        auVar28._0_32_ = ZEXT1632(auVar18);
        auVar14 = auVar14 ^ auVar17;
        auVar13 = auVar13 ^ local_48;
        uVar6 = __n + 0x20;
        while( true ) {
          auVar30 = ZEXT1664(auVar13);
          auVar29 = ZEXT1664(auVar14);
          auVar16 = auVar25._0_16_;
          auVar24 = auVar26._0_16_;
          auVar18 = auVar22._0_16_;
          auVar11 = auVar28._0_16_;
          auVar21 = auVar23._0_16_;
          if (extra_in_len <= uVar6) break;
          auVar15 = *(undefined1 (*) [16])(extra_in + __n);
          auVar27 = *(undefined1 (*) [16])(extra_in + __n + 0x10);
          auVar9 = vpand_avx(auVar16,auVar24);
          auVar10 = auVar12._0_16_;
          auVar17 = vpand_avx(auVar10,auVar18);
          *(undefined1 (*) [16])(out_tag + __n) = auVar9 ^ auVar11 ^ auVar18 ^ auVar15;
          auVar9 = aesenc(auVar18,auVar10);
          auVar18 = aesenc(auVar21,auVar18);
          auVar22._0_32_ = ZEXT1632(auVar18);
          auVar18 = aesenc(auVar13,auVar21);
          auVar23._0_32_ = ZEXT1632(auVar18);
          auVar13 = aesenc(auVar16,auVar13);
          auVar18 = aesenc(auVar24,auVar16);
          auVar25._0_32_ = ZEXT1632(auVar18);
          auVar18 = aesenc(auVar11,auVar24);
          auVar26._0_32_ = ZEXT1632(auVar18);
          auVar18 = aesenc(auVar14,auVar11);
          auVar28._0_32_ = ZEXT1632(auVar18);
          auVar14 = aesenc(auVar10,auVar14);
          *(undefined1 (*) [16])(out_tag + __n + 0x10) = auVar24 ^ auVar21 ^ auVar17 ^ auVar27;
          auVar14 = auVar14 ^ auVar15;
          auVar13 = auVar13 ^ auVar27;
          uVar6 = __n + 0x40;
          auVar12 = ZEXT1664(auVar9);
          __n = __n + 0x20;
        }
        auVar19 = ZEXT1664(auVar9);
        sVar7 = extra_in_len - __n;
        if (sVar7 != 0) {
          local_b8 = ZEXT816(0);
          uStack_a8 = 0;
          uStack_a0 = 0;
          memcpy(local_b8,extra_in + __n,sVar7);
          auVar27._8_8_ = uStack_a0;
          auVar27._0_8_ = uStack_a8;
          auVar15 = vpand_avx(auVar16,auVar24);
          local_88 = auVar15 ^ auVar11 ^ auVar18 ^ local_b8;
          auVar15 = vpand_avx(auVar18,auVar9);
          local_78 = auVar15 ^ auVar21 ^ auVar24 ^ auVar27;
          auVar15 = aesenc(auVar9,auVar14);
          auVar15 = auVar15 ^ local_b8;
          auVar14 = aesenc(auVar14,auVar11);
          auVar11 = aesenc(auVar11,auVar24);
          auVar24 = aesenc(auVar24,auVar16);
          auVar16 = aesenc(auVar16,auVar13);
          auVar17 = aesenc(auVar13,auVar21);
          auVar21 = aesenc(auVar21,auVar18);
          auVar9 = aesenc(auVar18,auVar9);
          memcpy(out_tag + __n,local_88,sVar7);
          auVar19 = ZEXT1664(auVar9);
          auVar22 = ZEXT1664(auVar21);
          auVar23 = ZEXT1664(auVar17);
          auVar30 = ZEXT1664(auVar16 ^ auVar27);
          auVar25 = ZEXT1664(auVar24);
          auVar26 = ZEXT1664(auVar11);
          auVar28 = ZEXT1664(auVar14);
          auVar29 = ZEXT1664(auVar15);
        }
      }
      auVar18._8_8_ = 0;
      auVar18._0_8_ = in_len + extra_in_len;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = ad_len;
      auVar9 = vpunpcklqdq_avx(auVar21,auVar18);
      auVar9 = vpsllq_avx(auVar9,3);
      auVar9 = auVar26._0_16_ ^ auVar9;
      iVar2 = 7;
      do {
        auVar18 = aesenc(auVar19._0_16_,auVar29._0_16_);
        auVar21 = aesenc(auVar22._0_16_,auVar19._0_16_);
        auVar19._0_32_ = ZEXT1632(auVar21);
        auVar16 = aesenc(auVar23._0_16_,auVar22._0_16_);
        auVar22._0_32_ = ZEXT1632(auVar16);
        auVar24 = aesenc(auVar30._0_16_,auVar23._0_16_);
        auVar23._0_32_ = ZEXT1632(auVar24);
        auVar21 = aesenc(auVar25._0_16_,auVar30._0_16_);
        auVar11 = aesenc(auVar26._0_16_,auVar25._0_16_);
        auVar25._0_32_ = ZEXT1632(auVar11);
        auVar15 = aesenc(auVar28._0_16_,auVar26._0_16_);
        auVar26._0_32_ = ZEXT1632(auVar15);
        auVar27 = aesenc(auVar29._0_16_,auVar28._0_16_);
        auVar28._0_32_ = ZEXT1632(auVar27);
        auVar18 = auVar18 ^ auVar9;
        auVar29 = ZEXT1664(auVar18);
        auVar21 = auVar21 ^ auVar9;
        auVar30 = ZEXT1664(auVar21);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      *(undefined1 (*) [16])(out_tag + extra_in_len) =
           auVar18 ^ auVar21 ^ auVar24 ^ auVar16 ^ auVar27 ^ auVar11 ^ auVar15;
      *local_90 = bVar1 + extra_in_len;
      return 1;
    }
    iVar2 = 0x79;
    line = 0xdf;
  }
  ERR_put_error(0x1e,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128l.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128l_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;

  return aegis_128l_seal_scatter(
      aegis_ctx->key, out, out_tag, out_tag_len, max_out_tag_len, nonce,
      nonce_len, in, in_len, extra_in, extra_in_len, ad, ad_len, ctx->tag_len);
}